

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# current_setting.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::CurrentSettingBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  SettingLookupResult SVar1;
  int iVar2;
  reference this_00;
  pointer pEVar3;
  type expr;
  string *psVar4;
  ParserException *pPVar5;
  ParameterNotResolvedException *this_01;
  undefined8 local_e8;
  string key;
  LogicalType local_c0;
  Value val;
  Value key_val;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::get<true>(arguments,0);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  if ((pEVar3->return_type).id_ == UNKNOWN) {
    this_01 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_01);
    __cxa_throw(this_01,&ParameterNotResolvedException::typeinfo,
                ::std::runtime_error::~runtime_error);
  }
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  if ((pEVar3->return_type).id_ == VARCHAR) {
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    if ((pEVar3->return_type).id_ == VARCHAR) {
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_00);
      iVar2 = (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar3);
      if ((char)iVar2 != '\0') {
        expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(this_00);
        ExpressionExecutor::EvaluateScalar(&key_val,context,expr,false);
        if (key_val.is_null == false) {
          psVar4 = StringValue::Get_abi_cxx11_(&key_val);
          if (psVar4->_M_string_length != 0) {
            psVar4 = StringValue::Get_abi_cxx11_(&key_val);
            StringUtil::Lower(&key,psVar4);
            LogicalType::LogicalType(&local_c0,SQLNULL);
            Value::Value(&val,&local_c0);
            LogicalType::~LogicalType(&local_c0);
            SVar1 = ClientContext::TryGetCurrentSetting(context,&key,&val);
            if (SVar1.scope == INVALID) {
              Catalog::AutoloadExtensionByConfigName(context,&key);
              ClientContext::TryGetCurrentSetting(context,&key,&val);
            }
            LogicalType::operator=
                      (&(bound_function->super_BaseScalarFunction).return_type,&val.type_);
            make_uniq<duckdb::CurrentSettingBindData,duckdb::Value&>((duckdb *)&local_e8,&val);
            *(undefined8 *)this = local_e8;
            Value::~Value(&val);
            ::std::__cxx11::string::~string((string *)&key);
            Value::~Value(&key_val);
            return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
                   (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
                   this;
          }
        }
        pPVar5 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&val,"Key name for current_setting needs to be neither NULL nor empty",
                   (allocator *)&key);
        ParserException::ParserException(pPVar5,(string *)&val);
        __cxa_throw(pPVar5,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  pPVar5 = (ParserException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&key_val,"Key name for current_setting needs to be a constant string",
             (allocator *)&val);
  ParserException::ParserException(pPVar5,(string *)&key_val);
  __cxa_throw(pPVar5,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FunctionData> CurrentSettingBind(ClientContext &context, ScalarFunction &bound_function,
                                            vector<unique_ptr<Expression>> &arguments) {

	auto &key_child = arguments[0];
	if (key_child->return_type.id() == LogicalTypeId::UNKNOWN) {
		throw ParameterNotResolvedException();
	}
	if (key_child->return_type.id() != LogicalTypeId::VARCHAR ||
	    key_child->return_type.id() != LogicalTypeId::VARCHAR || !key_child->IsFoldable()) {
		throw ParserException("Key name for current_setting needs to be a constant string");
	}
	Value key_val = ExpressionExecutor::EvaluateScalar(context, *key_child);
	D_ASSERT(key_val.type().id() == LogicalTypeId::VARCHAR);
	if (key_val.IsNull() || StringValue::Get(key_val).empty()) {
		throw ParserException("Key name for current_setting needs to be neither NULL nor empty");
	}

	auto key = StringUtil::Lower(StringValue::Get(key_val));
	Value val;
	if (!context.TryGetCurrentSetting(key, val)) {
		Catalog::AutoloadExtensionByConfigName(context, key);
		// If autoloader didn't throw, the config is now available
		context.TryGetCurrentSetting(key, val);
	}

	bound_function.return_type = val.type();
	return make_uniq<CurrentSettingBindData>(val);
}